

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_1::thirdparty_messages(DebugMessageTestContext *ctx)

{
  allocator<char> local_31;
  string local_30;
  DebugMessageTestContext *local_10;
  DebugMessageTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Messages with source of GL_DEBUG_SOURCE_THIRD_PARTY",&local_31);
  NegativeTestShared::NegativeTestContext::beginSection(&ctx->super_NegativeTestContext,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  emitMessages(local_10,0x8249);
  NegativeTestShared::NegativeTestContext::endSection(&local_10->super_NegativeTestContext);
  return;
}

Assistant:

void thirdparty_messages (DebugMessageTestContext& ctx)
{
	ctx.beginSection("Messages with source of GL_DEBUG_SOURCE_THIRD_PARTY");
	emitMessages(ctx, GL_DEBUG_SOURCE_THIRD_PARTY);
	ctx.endSection();
}